

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.h
# Opt level: O3

void __thiscall TransArray::add(TransArray *this,int fd,int item,int use_seq,int pos,int custid)

{
  int iVar1;
  
  iVar1 = this->theSize;
  if (use_seq == 0) {
    if (this->totSize < (long)iVar1 + 1) {
      flushbuf(this,fd,0,pos);
    }
  }
  else {
    if (this->totSize < (long)iVar1 + 2) {
      flushbuf(this,fd,use_seq,pos);
      iVar1 = this->theSize;
    }
    this->theSize = iVar1 + 1;
    (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = custid;
  }
  iVar1 = this->theSize;
  this->theSize = iVar1 + 1;
  (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = item;
  return;
}

Assistant:

void add(int fd, int item, int use_seq, int pos, int custid = -1) {
        if (use_seq) {
            if (theSize + 2 > totSize) {
                flushbuf(fd, use_seq, pos);
            }
            theArray[theSize++] = custid;
        } else {
            if (theSize + 1 > totSize) {
                flushbuf(fd, use_seq, pos);
            }
        }
        theArray[theSize++] = item;
    }